

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct>::ConvertFromStruct
          (JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct> *this,
          vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *list)

{
  bool bVar1;
  value_type *in_RDI;
  PsbtGlobalXpub object;
  PsbtGlobalXpubStruct *element;
  const_iterator __end0;
  const_iterator __begin0;
  vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *__range3;
  PsbtGlobalXpubStruct *in_stack_fffffffffffffe98;
  PsbtGlobalXpub *in_stack_fffffffffffffea0;
  vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
  *in_stack_fffffffffffffeb0;
  PsbtGlobalXpub *in_stack_fffffffffffffef0;
  __normal_iterator<const_PsbtGlobalXpubStruct_*,_std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (PsbtGlobalXpubStruct *)
       ::std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::begin
                 (in_stack_fffffffffffffe98);
  ::std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::end
            ((vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> *)
             in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_PsbtGlobalXpubStruct_*,_std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>_>
                        *)in_stack_fffffffffffffea0,
                       (__normal_iterator<const_PsbtGlobalXpubStruct_*,_std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>_>
                        *)in_stack_fffffffffffffe98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_PsbtGlobalXpubStruct_*,_std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>_>
    ::operator*(local_20);
    in_stack_fffffffffffffea0 = (PsbtGlobalXpub *)&stack0xfffffffffffffec0;
    cfd::api::json::PsbtGlobalXpub::PsbtGlobalXpub(in_stack_fffffffffffffef0);
    cfd::api::json::PsbtGlobalXpub::ConvertFromStruct
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    ::std::vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>::
    push_back(in_stack_fffffffffffffeb0,in_RDI);
    cfd::api::json::PsbtGlobalXpub::~PsbtGlobalXpub(in_stack_fffffffffffffea0);
    __gnu_cxx::
    __normal_iterator<const_PsbtGlobalXpubStruct_*,_std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }